

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall
GraphTestDyndepLoadImplicit::GraphTestDyndepLoadImplicit(GraphTestDyndepLoadImplicit *this)

{
  GraphTest::GraphTest(&this->super_GraphTest);
  (this->super_GraphTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__GraphTest_001e3e88;
  return;
}

Assistant:

TEST_F(GraphTest, DyndepLoadImplicit) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out1: r in || dd\n"
"  dyndep = dd\n"
"build out2: r in\n"
  );
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
"build out1: dyndep | out2\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd")->dyndep_pending());
  EXPECT_TRUE(scan_.LoadDyndeps(GetNode("dd"), &err));
  EXPECT_EQ("", err);
  EXPECT_FALSE(GetNode("dd")->dyndep_pending());

  Edge* edge = GetNode("out1")->in_edge();
  ASSERT_EQ(1u, edge->outputs_.size());
  EXPECT_EQ("out1", edge->outputs_[0]->path());
  ASSERT_EQ(3u, edge->inputs_.size());
  EXPECT_EQ("in", edge->inputs_[0]->path());
  EXPECT_EQ("out2", edge->inputs_[1]->path());
  EXPECT_EQ("dd", edge->inputs_[2]->path());
  EXPECT_EQ(1u, edge->implicit_deps_);
  EXPECT_EQ(1u, edge->order_only_deps_);
  EXPECT_FALSE(edge->GetBindingBool("restat"));
}